

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

dgBigVector * __thiscall
dgPolyhedra::FaceNormal
          (dgBigVector *__return_storage_ptr__,dgPolyhedra *this,dgEdge *face,HaF64 *pool,
          HaI32 strideInBytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  dgEdge *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  dgBigVector e1;
  dgBigVector p2;
  dgBigVector e2;
  dgBigVector p0;
  dgBigVector p1;
  undefined1 local_f8 [16];
  double local_e8;
  double local_e0;
  dgBigVector local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  double local_a0;
  dgBigVector local_98;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  
  lVar3 = (long)(strideInBytes >> 3);
  dgBigVector::dgBigVector((dgBigVector *)local_78,pool + face->m_incidentVertex * lVar3);
  pdVar4 = face->m_next;
  dgBigVector::dgBigVector((dgBigVector *)local_58,pool + pdVar4->m_incidentVertex * lVar3);
  local_b8 = vsubpd_avx(local_58,local_78);
  local_a8 = local_48 - local_68;
  local_a0 = local_40;
  dgBigVector::dgBigVector(&local_d8,(dgTemplateVector<double> *)local_b8);
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = 0.0;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = 0.0;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = 0.0;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_w = 0.0;
  while (pdVar4 = pdVar4->m_next, pdVar4 != face) {
    dgBigVector::dgBigVector((dgBigVector *)local_b8,pool + pdVar4->m_incidentVertex * lVar3);
    local_f8 = vsubpd_avx(local_b8,local_78);
    local_e8 = local_a8 - local_68;
    local_e0 = local_a0;
    dgBigVector::dgBigVector(&local_98,(dgTemplateVector<double> *)local_f8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_d8.super_dgTemplateVector<double>.m_x;
    auVar8._8_8_ = local_d8.super_dgTemplateVector<double>.m_z;
    auVar8._0_8_ = local_d8.super_dgTemplateVector<double>.m_z;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_98.super_dgTemplateVector<double>.m_x;
    auVar10._8_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar10._0_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar1._8_8_ = local_d8.super_dgTemplateVector<double>.m_z;
    auVar1._0_8_ = local_d8.super_dgTemplateVector<double>.m_y;
    auVar2._8_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar2._0_8_ = local_98.super_dgTemplateVector<double>.m_y;
    auVar6 = vunpcklpd_avx(auVar8,auVar7);
    auVar5 = vunpcklpd_avx(auVar10,auVar5);
    auVar9._0_8_ = local_98.super_dgTemplateVector<double>.m_y * auVar6._0_8_;
    auVar9._8_8_ = local_98.super_dgTemplateVector<double>.m_z * auVar6._8_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_98.super_dgTemplateVector<double>.m_x *
                   local_d8.super_dgTemplateVector<double>.m_y;
    auVar6 = vfmsub231sd_fma(auVar6,auVar7,auVar2);
    local_f8 = vfmsub213pd_fma(auVar5,auVar1,auVar9);
    local_e8 = auVar6._0_8_;
    local_e0 = local_d8.super_dgTemplateVector<double>.m_w;
    dgTemplateVector<double>::operator+=
              (&__return_storage_ptr__->super_dgTemplateVector<double>,
               (dgTemplateVector<double> *)local_f8);
    local_d8.super_dgTemplateVector<double>.m_x = local_98.super_dgTemplateVector<double>.m_x;
    local_d8.super_dgTemplateVector<double>.m_y = local_98.super_dgTemplateVector<double>.m_y;
    local_d8.super_dgTemplateVector<double>.m_z = local_98.super_dgTemplateVector<double>.m_z;
    local_d8.super_dgTemplateVector<double>.m_w = local_98.super_dgTemplateVector<double>.m_w;
  }
  return __return_storage_ptr__;
}

Assistant:

dgBigVector dgPolyhedra::FaceNormal (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes) const
{
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF64);
	dgEdge* edge = face;
	dgBigVector p0 (&pool[edge->m_incidentVertex * stride]);
	edge = edge->m_next;
	dgBigVector p1 (&pool[edge->m_incidentVertex * stride]);
	dgBigVector e1 (p1 - p0);

	dgBigVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	for (edge = edge->m_next; edge != face; edge = edge->m_next) {
		dgBigVector p2 (&pool[edge->m_incidentVertex * stride]);
		dgBigVector e2 (p2 - p0);
		normal += e1 * e2;
		e1 = e2;
	} 
	return normal;
}